

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# privsock.c
# Opt level: O1

int priv_sock_get_int(int fd)

{
  undefined *puVar1;
  uint uVar2;
  int iVar3;
  in_addr_t iVar4;
  undefined8 in_RAX;
  ssize_t sVar5;
  ssize_t sVar6;
  hostent *phVar7;
  ulong uVar8;
  uint the_int;
  uint extraout_EDX;
  int *buf;
  ulong uVar9;
  uint uVar10;
  int *piVar11;
  int *piVar12;
  msghdr *__message;
  sockaddr *__addr;
  char *__cp;
  char *pcVar13;
  undefined1 *puVar14;
  ulong uVar15;
  int res;
  undefined4 uStack_1ac;
  sockaddr sStack_1a8;
  char acStack_198 [24];
  int *piStack_180;
  char *pcStack_178;
  ulong uStack_170;
  code *pcStack_168;
  sockaddr sStack_160;
  undefined4 uStack_14c;
  int *piStack_148;
  char *pcStack_140;
  ulong uStack_138;
  code *pcStack_130;
  undefined1 uStack_121;
  iovec iStack_120;
  msghdr mStack_110;
  undefined1 auStack_d8 [16];
  code *pcStack_c8;
  undefined1 uStack_b1;
  iovec iStack_b0;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined4 uStack_90;
  undefined1 auStack_80 [48];
  undefined8 uStack_50;
  ulong uStack_40;
  int *piStack_38;
  int local_4;
  
  local_4 = (int)((ulong)in_RAX >> 0x20);
  uVar8 = (ulong)(uint)fd;
  piVar11 = &local_4;
  sVar5 = readn(fd,piVar11,4);
  if ((int)sVar5 == 4) {
    return local_4;
  }
  priv_sock_get_int_cold_1();
  uVar9 = uVar8 & 0xffffffff;
  priv_sock_send_int((int)uVar8,the_int);
  __cp = (char *)(uVar8 & 0xffffffff);
  buf = piVar11;
  sVar5 = writen((int)uVar8,piVar11,(ulong)the_int);
  if ((uint)sVar5 == the_int) {
    return (uint)sVar5;
  }
  priv_sock_send_buf_cold_1();
  iVar3 = (int)__cp;
  pcVar13 = (char *)((ulong)__cp & 0xffffffff);
  uStack_50._0_4_ = 0x106478;
  uStack_50._4_4_ = 0;
  piVar12 = buf;
  uStack_40 = (ulong)the_int;
  piStack_38 = piVar11;
  uVar2 = priv_sock_get_int(iVar3);
  uStack_90 = SUB84(piVar12,0);
  if (extraout_EDX < uVar2) {
    uStack_50._0_4_ = 0x1064a0;
    uStack_50._4_4_ = 0;
    priv_sock_recv_buf_cold_2();
  }
  else {
    uVar9 = (ulong)uVar2;
    uStack_50._0_4_ = 0x10648c;
    uStack_50._4_4_ = 0;
    piVar11 = buf;
    __cp = pcVar13;
    sVar5 = readn(iVar3,buf,(ulong)uVar2);
    uStack_90 = SUB84(piVar11,0);
    if (uVar2 == (uint)sVar5) {
      return (uint)sVar5;
    }
  }
  uStack_50 = priv_sock_send_fd;
  priv_sock_recv_buf_cold_1();
  iStack_b0.iov_base = &uStack_b1;
  uStack_b1 = 0;
  auStack_80._32_8_ = &uStack_a0;
  auStack_80._40_8_ = 0x18;
  uStack_98 = 0x100000001;
  uStack_a0 = 0x14;
  auStack_80._0_8_ = (void *)0x0;
  auStack_80._8_4_ = 0;
  auStack_80._16_8_ = &iStack_b0;
  auStack_80._24_8_ = 1;
  uStack_50 = (code *)((ulong)uStack_50 & 0xffffffff00000000);
  iStack_b0.iov_len = 1;
  pcStack_c8 = (code *)0x106dbd;
  sVar6 = sendmsg((int)__cp,(msghdr *)auStack_80,0);
  if ((int)sVar6 == 1) {
    return 1;
  }
  pcStack_c8 = recv_fd;
  send_fd_cold_1();
  iStack_120.iov_base = &uStack_121;
  mStack_110.msg_iov = &iStack_120;
  iStack_120.iov_len = 1;
  __message = &mStack_110;
  mStack_110.msg_name = (void *)0x0;
  mStack_110.msg_namelen = 0;
  mStack_110.msg_iovlen = 1;
  mStack_110.msg_control = auStack_d8;
  mStack_110.msg_controllen = 0x18;
  mStack_110.msg_flags = 0;
  pcStack_c8 = (code *)CONCAT44(pcStack_c8._4_4_,0xffffffff);
  pcStack_130 = (code *)0x106e21;
  sVar6 = recvmsg((int)__cp,__message,0);
  if ((int)sVar6 == 1) {
    if ((mStack_110.msg_controllen < 0x10) ||
       ((undefined1 *)mStack_110.msg_control == (undefined1 *)0x0)) goto LAB_00106e4a;
    if (*(int *)((long)mStack_110.msg_control + 0x10) != -1) {
      return *(int *)((long)mStack_110.msg_control + 0x10);
    }
  }
  else {
    pcStack_130 = (code *)0x106e4a;
    recv_fd_cold_1();
LAB_00106e4a:
    pcStack_130 = (code *)0x106e4f;
    recv_fd_cold_3();
  }
  pcStack_130 = tcp_server;
  recv_fd_cold_2();
  uVar8 = (ulong)__message & 0xffffffff;
  uVar15 = 0;
  pcStack_168 = (code *)0x106e77;
  piStack_148 = buf;
  pcStack_140 = pcVar13;
  uStack_138 = (ulong)extraout_EDX;
  pcStack_130 = (code *)uVar9;
  uVar2 = socket(2,1,0);
  if ((int)uVar2 < 0) {
    pcStack_168 = (code *)0x106f22;
    tcp_server_cold_3();
LAB_00106f22:
    iVar3 = (int)buf;
    pcStack_168 = (code *)0x106f29;
    tcp_server_cold_2();
  }
  else {
    buf = (int *)(ulong)uVar2;
    sStack_160.sa_data[6] = '\0';
    sStack_160.sa_data[7] = '\0';
    sStack_160.sa_data[8] = '\0';
    sStack_160.sa_data[9] = '\0';
    sStack_160.sa_data[10] = '\0';
    sStack_160.sa_data[0xb] = '\0';
    sStack_160.sa_data[0xc] = '\0';
    sStack_160.sa_data[0xd] = '\0';
    sStack_160.sa_data._0_2_ = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
    uVar8 = CONCAT62((int6)(uVar8 >> 0x10),sStack_160.sa_data._0_2_);
    sStack_160.sa_family = 2;
    sStack_160.sa_data._2_4_ = 0;
    if (__cp == (char *)0x0) {
LAB_00106ec9:
      sStack_160.sa_data._2_4_ = (int)uVar15;
LAB_00106ece:
      uStack_14c = 1;
      pcStack_168 = (code *)0x106ef0;
      setsockopt(uVar2,1,2,&uStack_14c,4);
      pcStack_168 = (code *)0x106eff;
      iVar3 = bind(uVar2,&sStack_160,0x10);
      if (iVar3 != -1) {
        pcStack_168 = (code *)0x106f10;
        listen(uVar2,0x400);
        return uVar2;
      }
      goto LAB_00106f22;
    }
    pcStack_168 = (code *)0x106eae;
    iVar3 = inet_pton(2,__cp,sStack_160.sa_data + 2);
    if (iVar3 != 0) goto LAB_00106ece;
    pcStack_168 = (code *)0x106eba;
    pcVar13 = __cp;
    phVar7 = gethostbyname(__cp);
    iVar3 = (int)pcVar13;
    if (phVar7 != (hostent *)0x0) {
      uVar15 = (ulong)*(uint *)*phVar7->h_addr_list;
      goto LAB_00106ec9;
    }
  }
  pcStack_168 = tcp_client;
  tcp_server_cold_1();
  puVar14 = (undefined1 *)0x2;
  __addr = (sockaddr *)0x1;
  piStack_180 = buf;
  pcStack_178 = __cp;
  uStack_170 = uVar15;
  pcStack_168 = (code *)uVar8;
  uVar2 = socket(2,1,0);
  if (-1 < (int)uVar2) {
    if (iVar3 != 0) {
      uStack_1ac = 1;
      setsockopt(uVar2,1,2,&uStack_1ac,4);
      acStack_198[0] = '\0';
      acStack_198[1] = '\0';
      acStack_198[2] = '\0';
      acStack_198[3] = '\0';
      acStack_198[4] = '\0';
      acStack_198[5] = '\0';
      acStack_198[6] = '\0';
      acStack_198[7] = '\0';
      acStack_198[8] = '\0';
      acStack_198[9] = '\0';
      acStack_198[10] = '\0';
      acStack_198[0xb] = '\0';
      acStack_198[0xc] = '\0';
      acStack_198[0xd] = '\0';
      acStack_198[0xe] = '\0';
      acStack_198[0xf] = '\0';
      getlocalip(acStack_198);
      __addr = &sStack_1a8;
      sStack_1a8.sa_data[6] = '\0';
      sStack_1a8.sa_data[7] = '\0';
      sStack_1a8.sa_data[8] = '\0';
      sStack_1a8.sa_data[9] = '\0';
      sStack_1a8.sa_data[10] = '\0';
      sStack_1a8.sa_data[0xb] = '\0';
      sStack_1a8.sa_data[0xc] = '\0';
      sStack_1a8.sa_data[0xd] = '\0';
      sStack_1a8.sa_data._0_2_ = (short)iVar3;
      sStack_1a8.sa_family = 2;
      sStack_1a8.sa_data._2_4_ = 0;
      iVar4 = inet_addr(acStack_198);
      sStack_1a8.sa_data._2_4_ = iVar4;
      puVar14 = (undefined1 *)(ulong)uVar2;
      iVar3 = bind(uVar2,__addr,0x10);
      if (iVar3 < 0) goto LAB_00106fd3;
    }
    return uVar2;
  }
  tcp_client_cold_2();
LAB_00106fd3:
  tcp_client_cold_1();
  *puVar14 = 0x3f;
  uVar10 = (uint)__addr;
  uVar2 = (uVar10 & 0xf000) - 0x1000;
  uVar8 = (ulong)uVar2;
  if ((uVar2 < 0xc000) &&
     (uVar8 = (ulong)(uVar2 >> 0xc), (0xaabU >> (uVar2 >> 0xc & 0x1f) & 1) != 0)) {
    puVar1 = &DAT_00108f14 + uVar8;
    uVar8 = (ulong)CONCAT31((uint3)(uVar2 >> 0x14),*puVar1);
    *puVar14 = *puVar1;
  }
  if ((uVar10 >> 8 & 1) != 0) {
    puVar14[1] = 0x72;
  }
  if ((char)__addr < '\0') {
    puVar14[2] = 0x77;
  }
  if (((ulong)__addr & 0x40) != 0) {
    puVar14[3] = 0x78;
  }
  if (((ulong)__addr & 0x20) != 0) {
    puVar14[4] = 0x72;
  }
  if (((ulong)__addr & 0x10) != 0) {
    puVar14[5] = 0x77;
  }
  if (((ulong)__addr & 8) != 0) {
    puVar14[6] = 0x78;
  }
  if (((ulong)__addr & 4) != 0) {
    puVar14[7] = 0x72;
  }
  if (((ulong)__addr & 2) != 0) {
    puVar14[8] = 0x77;
  }
  if (((ulong)__addr & 1) != 0) {
    puVar14[9] = 0x78;
  }
  if ((uVar10 >> 0xb & 1) != 0) {
    uVar8 = CONCAT71((int7)(uVar8 >> 8),(puVar14[3] == 'x') << 5) | 0x53;
    puVar14[3] = (char)uVar8;
  }
  if ((uVar10 >> 10 & 1) != 0) {
    uVar8 = CONCAT71((int7)(uVar8 >> 8),(puVar14[6] == 'x') << 5) | 0x53;
    puVar14[6] = (char)uVar8;
  }
  iVar3 = (int)uVar8;
  if ((uVar10 >> 9 & 1) != 0) {
    uVar8 = CONCAT71((int7)(uVar8 >> 8),(puVar14[9] == 'x') << 5) | 0x53;
    iVar3 = (int)uVar8;
    puVar14[9] = (char)uVar8;
  }
  return iVar3;
}

Assistant:

int priv_sock_get_int(int fd) {
  int res;
  int ret;
  ret = readn(fd, &res, sizeof(res));
  if (ret != sizeof(res)) {
    fprintf(stderr, "priv_sock_get_result error\n");
    exit(EXIT_FAILURE);
  }
  return res;
}